

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_snap_alloc1(ASMState *as,IRRef ref)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Reg RVar5;
  IRIns *ir_00;
  bool bVar6;
  IRIns *pIStack_48;
  Reg r;
  IRIns *irc;
  IRIns *pIStack_38;
  RegSet allow;
  IRIns *irs;
  IRIns *ir;
  IRRef ref_local;
  ASMState *as_local;
  
  ir_00 = as->ir + ref;
  if ((0x7fff < ref) && ((ir_00->field_1).r != 0xfd)) {
    as->snapfilt1 = 1L << ((byte)ref & 0x3f) | as->snapfilt1;
    uVar1 = ref + 0xfb3ee249;
    uVar2 = uVar1 * 0x4000 | uVar1 >> 0x12;
    uVar3 = (uVar1 ^ ref) - uVar2;
    as->snapfilt2 =
         1L << (((byte)uVar3 ^ ((byte)(uVar2 << 5) | (byte)(uVar1 * 0x4000 >> 0x1b))) -
                (char)(uVar3 >> 0x13) & 0x3f) | as->snapfilt2;
    if ((((ir_00->field_1).r & 0x80) != 0) && ((ir_00->field_1).s == '\0')) {
      if ((ir_00->field_1).r == 0xfe) {
        (ir_00->field_1).r = 0xfd;
        if ((ir_00->field_1).o == 'T') {
          asm_snap_alloc1(as,(uint)(ir_00->field_0).op2);
        }
        else {
          for (pIStack_38 = as->ir + (as->snapref - 1); ir_00 < pIStack_38;
              pIStack_38 = pIStack_38 + -1) {
            if (((pIStack_38->field_1).r == 0xfe) &&
               (iVar4 = asm_sunk_store(as,ir_00,pIStack_38), iVar4 != 0)) {
              asm_snap_alloc1(as,(uint)(pIStack_38->field_0).op2);
            }
          }
        }
      }
      else if (((ir_00->field_1).o == '[') && ((ir_00->field_0).op2 == 0x1d3)) {
        for (pIStack_48 = as->ir + as->curins; ir_00 < pIStack_48; pIStack_48 = pIStack_48 + -1) {
          if (((((pIStack_48->field_0).op1 == ref) || ((pIStack_48->field_0).op2 == ref)) &&
              ((pIStack_48->field_1).r != 0xfe)) && ((pIStack_48->field_1).r != 0xfd))
          goto LAB_00173ce3;
        }
        asm_snap_alloc1(as,(uint)(ir_00->field_0).op1);
      }
      else {
LAB_00173ce3:
        bVar6 = true;
        if (((ir_00->field_1).t.irt & 0x1f) != 0xe) {
          bVar6 = ((ir_00->field_1).t.irt & 0x1f) == 0xd;
        }
        uVar1 = 0xbfef;
        if (bVar6) {
          uVar1 = 0xffff0000;
        }
        if (((as->freeset & uVar1) == 0) &&
           ((uVar1 != 0xffff0000 || (iVar4 = asm_snap_canremat(as), iVar4 == 0)))) {
          ra_spill(as,ir_00);
        }
        else {
          RVar5 = ra_allocref(as,ref,uVar1);
          if (((ir_00->field_1).t.irt & 0x40) == 0) {
            as->weakset = 1 << ((byte)RVar5 & 0x1f) | as->weakset;
          }
          if (as->mcp < as->mclim) {
            asm_mclimit(as);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void asm_snap_alloc1(ASMState *as, IRRef ref)
{
  IRIns *ir = IR(ref);
  if (!irref_isk(ref) && ir->r != RID_SUNK) {
    bloomset(as->snapfilt1, ref);
    bloomset(as->snapfilt2, hashrot(ref, ref + HASH_BIAS));
    if (ra_used(ir)) return;
    if (ir->r == RID_SINK) {
      ir->r = RID_SUNK;
#if LJ_HASFFI
      if (ir->o == IR_CNEWI) {  /* Allocate CNEWI value. */
	asm_snap_alloc1(as, ir->op2);
	if (LJ_32 && (ir+1)->o == IR_HIOP)
	  asm_snap_alloc1(as, (ir+1)->op2);
      } else
#endif
      {  /* Allocate stored values for TNEW, TDUP and CNEW. */
	IRIns *irs;
	lj_assertA(ir->o == IR_TNEW || ir->o == IR_TDUP || ir->o == IR_CNEW,
		   "sink of IR %04d has bad op %d", ref - REF_BIAS, ir->o);
	for (irs = IR(as->snapref-1); irs > ir; irs--)
	  if (irs->r == RID_SINK && asm_sunk_store(as, ir, irs)) {
	    lj_assertA(irs->o == IR_ASTORE || irs->o == IR_HSTORE ||
		       irs->o == IR_FSTORE || irs->o == IR_XSTORE,
		       "sunk store IR %04d has bad op %d",
		       (int)(irs - as->ir) - REF_BIAS, irs->o);
	    asm_snap_alloc1(as, irs->op2);
	    if (LJ_32 && (irs+1)->o == IR_HIOP)
	      asm_snap_alloc1(as, (irs+1)->op2);
	  }
      }
    } else {
      RegSet allow;
      if (ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT) {
	IRIns *irc;
	for (irc = IR(as->curins); irc > ir; irc--)
	  if ((irc->op1 == ref || irc->op2 == ref) &&
	      !(irc->r == RID_SINK || irc->r == RID_SUNK))
	    goto nosink;  /* Don't sink conversion if result is used. */
	asm_snap_alloc1(as, ir->op1);
	return;
      }
    nosink:
      allow = (!LJ_SOFTFP && irt_isfp(ir->t)) ? RSET_FPR : RSET_GPR;
      if ((as->freeset & allow) ||
	       (allow == RSET_FPR && asm_snap_canremat(as))) {
	/* Get a weak register if we have a free one or can rematerialize. */
	Reg r = ra_allocref(as, ref, allow);  /* Allocate a register. */
	if (!irt_isphi(ir->t))
	  ra_weak(as, r);  /* But mark it as weakly referenced. */
	checkmclim(as);
	RA_DBGX((as, "snapreg   $f $r", ref, ir->r));
      } else {
	ra_spill(as, ir);  /* Otherwise force a spill slot. */
	RA_DBGX((as, "snapspill $f $s", ref, ir->s));
      }
    }
  }
}